

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O0

ngx_int_t ngx_http_get_forwarded_addr_internal
                    (ngx_http_request_t *r,ngx_addr_t *addr,u_char *xff,size_t xfflen,
                    ngx_array_t *proxies,int recursive)

{
  ngx_int_t nVar1;
  undefined1 local_70 [8];
  ngx_addr_t paddr;
  ngx_int_t rc;
  u_char *p;
  int recursive_local;
  ngx_array_t *proxies_local;
  size_t xfflen_local;
  u_char *xff_local;
  ngx_addr_t *addr_local;
  ngx_http_request_t *r_local;
  
  nVar1 = ngx_cidr_match(addr->sockaddr,proxies);
  if (nVar1 == 0) {
    rc = (ngx_int_t)(xff + xfflen);
    proxies_local = (ngx_array_t *)xfflen;
    while ((rc = rc + -1, xff < (ulong)rc && ((*(char *)rc == ' ' || (*(char *)rc == ','))))) {
      proxies_local = (ngx_array_t *)((long)&proxies_local[-1].pool + 7);
    }
    for (; xff < (ulong)rc; rc = rc + -1) {
      if ((*(char *)rc == ' ') || (*(char *)rc == ',')) {
        rc = rc + 1;
        break;
      }
    }
    nVar1 = ngx_parse_addr_port(r->pool,(ngx_addr_t *)local_70,(u_char *)rc,
                                (long)proxies_local - (rc - (long)xff));
    if (nVar1 == 0) {
      addr->sockaddr = (sockaddr *)local_70;
      *(sockaddr **)&addr->socklen = paddr.sockaddr;
      (addr->name).len = paddr._8_8_;
      (addr->name).data = (u_char *)paddr.name.len;
      if ((recursive == 0) || ((ulong)rc <= xff)) {
        r_local = (ngx_http_request_t *)0x0;
      }
      else {
        r_local = (ngx_http_request_t *)
                  ngx_http_get_forwarded_addr_internal(r,addr,xff,(rc + -1) - (long)xff,proxies,1);
        if (r_local == (ngx_http_request_t *)0xfffffffffffffffb) {
          r_local = (ngx_http_request_t *)0xfffffffffffffffc;
        }
      }
    }
    else {
      r_local = (ngx_http_request_t *)0xfffffffffffffffb;
    }
  }
  else {
    r_local = (ngx_http_request_t *)0xfffffffffffffffb;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_get_forwarded_addr_internal(ngx_http_request_t *r, ngx_addr_t *addr,
    u_char *xff, size_t xfflen, ngx_array_t *proxies, int recursive)
{
    u_char      *p;
    ngx_int_t    rc;
    ngx_addr_t   paddr;

    if (ngx_cidr_match(addr->sockaddr, proxies) != NGX_OK) {
        return NGX_DECLINED;
    }

    for (p = xff + xfflen - 1; p > xff; p--, xfflen--) {
        if (*p != ' ' && *p != ',') {
            break;
        }
    }

    for ( /* void */ ; p > xff; p--) {
        if (*p == ' ' || *p == ',') {
            p++;
            break;
        }
    }

    if (ngx_parse_addr_port(r->pool, &paddr, p, xfflen - (p - xff)) != NGX_OK) {
        return NGX_DECLINED;
    }

    *addr = paddr;

    if (recursive && p > xff) {
        rc = ngx_http_get_forwarded_addr_internal(r, addr, xff, p - 1 - xff,
                                                  proxies, 1);

        if (rc == NGX_DECLINED) {
            return NGX_DONE;
        }

        /* rc == NGX_OK || rc == NGX_DONE  */
        return rc;
    }

    return NGX_OK;
}